

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxIdentifier::Resolve(FxIdentifier *this,FCompileContext *ctx)

{
  FScriptPosition *pFVar1;
  BYTE BVar2;
  PStruct *pPVar3;
  PClass *pPVar4;
  int iVar5;
  uint val;
  FxLocalVariableDeclaration *pFVar6;
  FxStackVariable *this_00;
  PClass *pPVar7;
  PField *pPVar8;
  PSymbol *pPVar9;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  FxSelf *pFVar10;
  FxConstant *this_01;
  PType *pPVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char *pcVar12;
  char *message;
  bool bVar13;
  FxExpression *self;
  PSymbolTable *symtbl;
  FxSelf *local_40;
  FName local_38 [2];
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  iVar5 = (this->Identifier).Index;
  if (ctx->Block == (FxCompoundStatement *)0x0) {
    pFVar6 = (FxLocalVariableDeclaration *)0x0;
  }
  else {
    local_38[0].Index = iVar5;
    pFVar6 = FxCompoundStatement::FindLocalVariable(ctx->Block,local_38,ctx);
  }
  pPVar4 = PClassActor::RegistrationInfo.MyClass;
  if (pFVar6 != (FxLocalVariableDeclaration *)0x0) {
    if ((pFVar6->super_FxExpression).ExprType == EFX_StaticArray) {
      this_00 = (FxStackVariable *)FMemArena::Alloc(&FxAlloc,0x38);
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(this_00->super_FxExpression).ScriptPosition,
                 &(this->super_FxExpression).ScriptPosition);
      (this_00->super_FxExpression).ValueType = (PType *)0x0;
      (this_00->super_FxExpression).isresolved = false;
      (this_00->super_FxExpression).NeedResult = true;
      (this_00->super_FxExpression).ExprType = EFX_StaticArrayVariable;
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_007106c0;
      this_00->membervar = (PField *)pFVar6;
      (this_00->super_FxExpression).ValueType = (pFVar6->super_FxExpression).ValueType;
    }
    else {
      BVar2 = ((pFVar6->super_FxExpression).ValueType)->RegType;
      this_00 = (FxStackVariable *)FMemArena::Alloc(&FxAlloc,0x38);
      if (BVar2 == 0x80) {
        FxStackVariable::FxStackVariable
                  (this_00,(pFVar6->super_FxExpression).ValueType,pFVar6->StackOffset,
                   &(this->super_FxExpression).ScriptPosition);
      }
      else {
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370
        ;
        FScriptPosition::FScriptPosition
                  (&(this_00->super_FxExpression).ScriptPosition,
                   &(this->super_FxExpression).ScriptPosition);
        (this_00->super_FxExpression).ValueType = (PType *)0x0;
        (this_00->super_FxExpression).isresolved = false;
        (this_00->super_FxExpression).NeedResult = true;
        (this_00->super_FxExpression).ExprType = EFX_LocalVariable;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00710658
        ;
        this_00->membervar = (PField *)pFVar6;
        (this_00->super_FxExpression).ValueType = (pFVar6->super_FxExpression).ValueType;
        this_00->AddressRequested = false;
        *(undefined4 *)&this_00->field_0x34 = 0;
      }
    }
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    UNRECOVERED_JUMPTABLE = (this_00->super_FxExpression)._vptr_FxExpression[2];
LAB_005316af:
    iVar5 = (*UNRECOVERED_JUMPTABLE)(this_00,ctx);
    return (FxExpression *)CONCAT44(extraout_var,iVar5);
  }
  if (iVar5 == 0x249) {
    pPVar3 = ((ctx->Function->Variants).Array)->SelfClass;
    if (pPVar3 == (PStruct *)0x0) {
      pcVar12 = "Unable to access class defaults from static function";
    }
    else {
      if ((pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
          Class == (PClass *)0x0) {
        pPVar7 = (PClass *)
                 (**(pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
                    super_DObject._vptr_DObject)(pPVar3);
        (pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.super_DObject.
        Class = pPVar7;
      }
      pPVar7 = (pPVar3->super_PNamedType).super_PCompoundType.super_PType.super_PTypeBase.
               super_DObject.Class;
      bVar13 = pPVar7 != (PClass *)0x0;
      if (pPVar7 != pPVar4 && bVar13) {
        do {
          pPVar7 = pPVar7->ParentClass;
          bVar13 = pPVar7 != (PClass *)0x0;
          if (pPVar7 == pPVar4) break;
        } while (pPVar7 != (PClass *)0x0);
      }
      if (bVar13) {
        this_00 = (FxStackVariable *)FMemArena::Alloc(&FxAlloc,0x38);
        pPVar8 = (PField *)FMemArena::Alloc(&FxAlloc,0x30);
        pFVar1 = &(this->super_FxExpression).ScriptPosition;
        (pPVar8->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject =
             (_func_int **)&PTR__FxExpression_00711370;
        FScriptPosition::FScriptPosition
                  ((FScriptPosition *)&(pPVar8->super_PSymbol).super_PTypeBase.super_DObject.Class,
                   pFVar1);
        (pPVar8->super_PSymbol).super_PTypeBase.super_DObject.GCNext = (DObject *)0x0;
        *(undefined2 *)&(pPVar8->super_PSymbol).super_PTypeBase.super_DObject.ObjectFlags = 0x100;
        *(undefined4 *)&(pPVar8->super_PSymbol).super_PTypeBase.super_DObject.field_0x24 = 0x24;
        (pPVar8->super_PSymbol).super_PTypeBase.super_DObject._vptr_DObject =
             (_func_int **)&PTR__FxExpression_00710728;
        *(undefined1 *)&pPVar8->Offset = 0;
        (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370
        ;
        FScriptPosition::FScriptPosition(&(this_00->super_FxExpression).ScriptPosition,pFVar1);
        (this_00->super_FxExpression).ValueType = (PType *)0x0;
        (this_00->super_FxExpression).isresolved = false;
        (this_00->super_FxExpression).NeedResult = true;
        (this_00->super_FxExpression).ExprType = EFX_ClassDefaults;
        (this_00->super_FxExpression)._vptr_FxExpression =
             (_func_int **)&PTR__FxClassDefaults_00710790;
        this_00->membervar = pPVar8;
        this_00->AddressRequested = false;
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        UNRECOVERED_JUMPTABLE = (this_00->super_FxExpression)._vptr_FxExpression[2];
        goto LAB_005316af;
      }
      pcVar12 = "\'Default\' requires an actor type.";
    }
    FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,pcVar12);
    goto LAB_00531a13;
  }
  if ((ctx->Function == (PFunction *)0x0) ||
     (pPVar3 = ((ctx->Function->Variants).Array)->SelfClass, pPVar3 == (PStruct *)0x0)) {
    pPVar9 = (PSymbol *)0x0;
  }
  else {
    local_40 = (FxSelf *)CONCAT44(local_40._4_4_,iVar5);
    pPVar9 = PSymbolTable::FindSymbolInTable
                       (&(pPVar3->super_PNamedType).super_PCompoundType.super_PType.Symbols,
                        (FName *)&local_40,(PSymbolTable **)local_38);
  }
  pPVar4 = PField::RegistrationInfo.MyClass;
  if (pPVar9 != (PSymbol *)0x0) {
    if ((pPVar9->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
      iVar5 = (**(pPVar9->super_PTypeBase).super_DObject._vptr_DObject)(pPVar9);
      (pPVar9->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar5);
    }
    pPVar7 = (pPVar9->super_PTypeBase).super_DObject.Class;
    bVar13 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar4 && bVar13) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar13 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar4) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (bVar13) {
      pFVar10 = (FxSelf *)FMemArena::Alloc(&FxAlloc,0x30);
      (pFVar10->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(pFVar10->super_FxExpression).ScriptPosition,
                 &(this->super_FxExpression).ScriptPosition);
      (pFVar10->super_FxExpression).ValueType = (PType *)0x0;
      (pFVar10->super_FxExpression).isresolved = false;
      (pFVar10->super_FxExpression).NeedResult = true;
      (pFVar10->super_FxExpression).ExprType = EFX_Self;
      (pFVar10->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00710728;
      pFVar10->check = false;
      local_40 = pFVar10;
      local_40 = (FxSelf *)FxSelf::Resolve(pFVar10,ctx);
      pPVar3 = ((ctx->Function->Variants).Array)->SelfClass;
      this_01 = (FxConstant *)ResolveMember(this,ctx,pPVar3,(FxExpression **)&local_40,pPVar3);
      if (this_01 == (FxConstant *)0x0) goto LAB_00531a13;
      goto LAB_005318a6;
    }
  }
  if (ctx->Class == (PStruct *)0x0) {
    pPVar11 = (PType *)0x0;
  }
  else {
    local_40 = (FxSelf *)CONCAT44(local_40._4_4_,(this->Identifier).Index);
    pPVar11 = (PType *)PSymbolTable::FindSymbolInTable
                                 (&(ctx->Class->super_PNamedType).super_PCompoundType.super_PType.
                                   Symbols,(FName *)&local_40,(PSymbolTable **)local_38);
  }
  pPVar4 = PSymbolConst::RegistrationInfo.MyClass;
  if (pPVar11 == (PType *)0x0) {
    if (this->noglobal == true) {
      (this->super_FxExpression).ValueType = &TypeError->super_PType;
      return &this->super_FxExpression;
    }
    local_40 = (FxSelf *)CONCAT44(local_40._4_4_,(this->Identifier).Index);
    pPVar11 = (PType *)PSymbolTable::FindSymbol(&GlobalSymbols,(FName *)&local_40,true);
    if (pPVar11 == (PType *)0x0) {
      iVar5 = 0;
      val = P_FindLineSpecial(FName::NameData.NameArray[(this->Identifier).Index].Text,(int *)0x0,
                              (int *)0x0);
      if (val != 0) {
        pFVar1 = &(this->super_FxExpression).ScriptPosition;
        FScriptPosition::Message
                  (pFVar1,8,"Resolving name \'%s\' as line special %d\n",
                   FName::NameData.NameArray[(this->Identifier).Index].Text,(ulong)val);
        this_01 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
        FxConstant::FxConstant(this_01,val,pFVar1);
        goto LAB_005318a6;
      }
      pPVar11 = (PType *)FindCVar(FName::NameData.NameArray[(this->Identifier).Index].Text,
                                  (FBaseCVar **)0x0);
      this_01 = (FxConstant *)0x0;
      if (pPVar11 != (PType *)0x0) {
        if (((ulong)(pPVar11->super_PTypeBase).super_DObject.ObjNext & 2) == 0) {
          this_01 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x30);
          (this_01->super_FxExpression)._vptr_FxExpression =
               (_func_int **)&PTR__FxExpression_00711370;
          FScriptPosition::FScriptPosition
                    (&(this_01->super_FxExpression).ScriptPosition,
                     &(this->super_FxExpression).ScriptPosition);
          (this_01->super_FxExpression).ValueType = (PType *)0x0;
          (this_01->super_FxExpression).isresolved = false;
          (this_01->super_FxExpression).NeedResult = true;
          (this_01->super_FxExpression).ExprType = EFX_CVar;
          (this_01->super_FxExpression)._vptr_FxExpression =
               (_func_int **)&PTR__FxExpression_00710860;
          (this_01->value).Type = pPVar11;
          iVar5 = 2;
        }
        else {
          this_01 = (FxConstant *)0x0;
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,2,
                     "Cannot access userinfo CVARs directly. Use GetCVar() instead.");
          (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
          iVar5 = 1;
        }
      }
      if (iVar5 == 2) goto LAB_005318a6;
      if (iVar5 != 0) {
        return &((FxIdentifier *)0x0)->super_FxExpression;
      }
      pcVar12 = FName::NameData.NameArray[(this->Identifier).Index].Text;
      message = "Unknown identifier \'%s\'";
    }
    else {
      bVar13 = DObject::IsKindOf((DObject *)pPVar11,PSymbolConst::RegistrationInfo.MyClass);
      if (bVar13) {
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,8,
                   "Resolving name \'%s\' as global constant\n",
                   FName::NameData.NameArray[(this->Identifier).Index].Text);
        goto LAB_0053189e;
      }
      bVar13 = DObject::IsKindOf((DObject *)pPVar11,PField::RegistrationInfo.MyClass);
      pFVar1 = &(this->super_FxExpression).ScriptPosition;
      pcVar12 = FName::NameData.NameArray[(this->Identifier).Index].Text;
      if (bVar13) {
        FScriptPosition::Message(pFVar1,8,"Resolving name \'%s\' as global variable\n",pcVar12);
        this_01 = (FxConstant *)FMemArena::Alloc(&FxAlloc,0x38);
        (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370
        ;
        FScriptPosition::FScriptPosition(&(this_01->super_FxExpression).ScriptPosition,pFVar1);
        (this_01->super_FxExpression).ValueType = (PType *)0x0;
        (this_01->super_FxExpression).isresolved = false;
        (this_01->super_FxExpression).NeedResult = true;
        (this_01->super_FxExpression).ExprType = EFX_GlobalVariable;
        (this_01->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_007107f8
        ;
        (this_01->value).Type = pPVar11;
        *(undefined2 *)&(this_01->value).field_1 = 0x100;
        goto LAB_005318a6;
      }
      message = "Invalid global identifier \'%s\'\n";
    }
  }
  else {
    if ((pPVar11->super_PTypeBase).super_DObject.Class == (PClass *)0x0) {
      iVar5 = (**(pPVar11->super_PTypeBase).super_DObject._vptr_DObject)(pPVar11);
      (pPVar11->super_PTypeBase).super_DObject.Class = (PClass *)CONCAT44(extraout_var_01,iVar5);
    }
    pPVar7 = (pPVar11->super_PTypeBase).super_DObject.Class;
    bVar13 = pPVar7 != (PClass *)0x0;
    if (pPVar7 != pPVar4 && bVar13) {
      do {
        pPVar7 = pPVar7->ParentClass;
        bVar13 = pPVar7 != (PClass *)0x0;
        if (pPVar7 == pPVar4) break;
      } while (pPVar7 != (PClass *)0x0);
    }
    if (bVar13) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,8,
                 "Resolving name \'%s\' as class constant\n",
                 FName::NameData.NameArray[(this->Identifier).Index].Text);
LAB_0053189e:
      this_01 = (FxConstant *)
                FxConstant::MakeConstant
                          ((PSymbol *)pPVar11,&(this->super_FxExpression).ScriptPosition);
LAB_005318a6:
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      if (this_01 == (FxConstant *)0x0) {
        return &((FxIdentifier *)0x0)->super_FxExpression;
      }
      iVar5 = (*(this_01->super_FxExpression)._vptr_FxExpression[2])(this_01,ctx);
      return &((FxIdentifier *)CONCAT44(extraout_var_02,iVar5))->super_FxExpression;
    }
    if ((((ctx->Function->Variants).Array)->SelfClass != ctx->Class) &&
       (bVar13 = DObject::IsKindOf((DObject *)pPVar11,PField::RegistrationInfo.MyClass), bVar13)) {
      pFVar10 = (FxSelf *)FMemArena::Alloc(&FxAlloc,0x30);
      pFVar1 = &(this->super_FxExpression).ScriptPosition;
      (pFVar10->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition(&(pFVar10->super_FxExpression).ScriptPosition,pFVar1);
      (pFVar10->super_FxExpression).ValueType = (PType *)0x0;
      (pFVar10->super_FxExpression).isresolved = false;
      (pFVar10->super_FxExpression).NeedResult = true;
      (pFVar10->super_FxExpression).ExprType = EFX_Self;
      (pFVar10->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00710728;
      pFVar10->check = true;
      local_40 = pFVar10;
      local_40 = (FxSelf *)FxSelf::Resolve(pFVar10,ctx);
      this_01 = (FxConstant *)
                ResolveMember(this,ctx,ctx->Class,(FxExpression **)&local_40,ctx->Class);
      if (this_01 == (FxConstant *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
        return &((FxIdentifier *)0x0)->super_FxExpression;
      }
      FScriptPosition::Message
                (pFVar1,3,"Self pointer used in ambiguous context; VM execution may abort!");
      ctx->Unsafe = true;
      goto LAB_005318a6;
    }
    bVar13 = DObject::IsKindOf((DObject *)pPVar11,PFunction::RegistrationInfo.MyClass);
    pcVar12 = FName::NameData.NameArray[(this->Identifier).Index].Text;
    message = "Invalid member identifier \'%s\'.\n";
    if (bVar13) {
      message = "Function \'%s\' used without ().\n";
    }
  }
  FScriptPosition::Message(&(this->super_FxExpression).ScriptPosition,2,message,pcVar12);
LAB_00531a13:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return &((FxIdentifier *)0x0)->super_FxExpression;
}

Assistant:

FxExpression *FxIdentifier::Resolve(FCompileContext& ctx)
{
	PSymbol * sym;
	FxExpression *newex = nullptr;
	int num;
	
	CHECKRESOLVED();

	// Local variables have highest priority.
	FxLocalVariableDeclaration *local = ctx.FindLocalVariable(Identifier);
	if (local != nullptr)
	{
		if (local->ExprType == EFX_StaticArray)
		{
			auto x = new FxStaticArrayVariable(local, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
		else if (local->ValueType->GetRegType() != REGT_NIL)
		{
			auto x = new FxLocalVariable(local, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
		else
		{
			auto x = new FxStackVariable(local->ValueType, local->StackOffset, ScriptPosition);
			delete this;
			return x->Resolve(ctx);
		}
	}

	if (Identifier == NAME_Default)
	{
		if (ctx.Function->Variants[0].SelfClass == nullptr)
		{
			ScriptPosition.Message(MSG_ERROR, "Unable to access class defaults from static function");
			delete this;
			return nullptr;
		}
		if (!ctx.Function->Variants[0].SelfClass->IsKindOf(RUNTIME_CLASS(PClassActor)))
		{
			ScriptPosition.Message(MSG_ERROR, "'Default' requires an actor type.");
			delete this;
			return nullptr;
		}

		FxExpression * x = new FxClassDefaults(new FxSelf(ScriptPosition), ScriptPosition);
		delete this;
		return x->Resolve(ctx);
	}

	// Ugh, the horror. Constants need to be taken from the owning class, but members from the self class to catch invalid accesses here...
	// see if the current class (if valid) defines something with this name.
	PSymbolTable *symtbl;

	// first check fields in self
	if ((sym = ctx.FindInSelfClass(Identifier, symtbl)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			FxExpression *self = new FxSelf(ScriptPosition);
			self = self->Resolve(ctx);
			newex = ResolveMember(ctx, ctx.Function->Variants[0].SelfClass, self, ctx.Function->Variants[0].SelfClass);
			ABORT(newex);
			goto foundit;
		}
	}

	// now check in the owning class.
	if (newex == nullptr && (sym = ctx.FindInClass(Identifier, symtbl)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
		{
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as class constant\n", Identifier.GetChars());
			newex = FxConstant::MakeConstant(sym, ScriptPosition);
			goto foundit;
		}
		// Do this check for ZScript as well, so that a clearer error message can be printed. MSG_OPTERROR will default to MSG_ERROR there.
		else if (ctx.Function->Variants[0].SelfClass != ctx.Class && sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			FxExpression *self = new FxSelf(ScriptPosition, true);
			self = self->Resolve(ctx);
			newex = ResolveMember(ctx, ctx.Class, self, ctx.Class);
			ABORT(newex);
			ScriptPosition.Message(MSG_OPTERROR, "Self pointer used in ambiguous context; VM execution may abort!");
			ctx.Unsafe = true;
			goto foundit;
		}
		else
		{
			if (sym->IsKindOf(RUNTIME_CLASS(PFunction)))
			{
				ScriptPosition.Message(MSG_ERROR, "Function '%s' used without ().\n", Identifier.GetChars());
			}
			else
			{
				ScriptPosition.Message(MSG_ERROR, "Invalid member identifier '%s'.\n", Identifier.GetChars());
			}
			delete this;
			return nullptr;
		}
	}

	if (noglobal)
	{
		// This is needed to properly resolve class names on the left side of the member access operator
		ValueType = TypeError;
		return this;
	}

	// now check the global identifiers.
	if (newex == nullptr && (sym = ctx.FindGlobal(Identifier)) != nullptr)
	{
		if (sym->IsKindOf(RUNTIME_CLASS(PSymbolConst)))
		{
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as global constant\n", Identifier.GetChars());
			newex = FxConstant::MakeConstant(sym, ScriptPosition);
			goto foundit;
		}
		else if (sym->IsKindOf(RUNTIME_CLASS(PField)))
		{
			// internally defined global variable
			ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as global variable\n", Identifier.GetChars());
			newex = new FxGlobalVariable(static_cast<PField *>(sym), ScriptPosition);
			goto foundit;
		}
		else
		{
			ScriptPosition.Message(MSG_ERROR, "Invalid global identifier '%s'\n", Identifier.GetChars());
			delete this;
			return nullptr;
		}
	}

	// and line specials
	if (newex == nullptr && (num = P_FindLineSpecial(Identifier, nullptr, nullptr)))
	{
		ScriptPosition.Message(MSG_DEBUGLOG, "Resolving name '%s' as line special %d\n", Identifier.GetChars(), num);
		newex = new FxConstant(num, ScriptPosition);
		goto foundit;
	}

	if (auto *cvar = FindCVar(Identifier.GetChars(), nullptr))
	{
		if (cvar->GetFlags() & CVAR_USERINFO)
		{
			ScriptPosition.Message(MSG_ERROR, "Cannot access userinfo CVARs directly. Use GetCVar() instead.");
			delete this;
			return nullptr;
		}
		newex = new FxCVar(cvar, ScriptPosition);
		goto foundit;
	}
	
	ScriptPosition.Message(MSG_ERROR, "Unknown identifier '%s'", Identifier.GetChars());
	delete this;
	return nullptr;

foundit:
	delete this;
	return newex? newex->Resolve(ctx) : nullptr;
}